

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

void __thiscall kratos::ActiveVisitor::visit(ActiveVisitor *this,IfStmt *stmt)

{
  allocator<const_kratos::IRNode_*> *this_00;
  initializer_list<const_kratos::IRNode_*> __l;
  initializer_list<const_kratos::IRNode_*> __l_00;
  initializer_list<const_kratos::IRNode_*> __l_01;
  initializer_list<const_kratos::IRNode_*> __l_02;
  initializer_list<const_kratos::IRNode_*> __l_03;
  initializer_list<const_kratos::IRNode_*> __l_04;
  bool bVar1;
  VarType VVar2;
  PortType PVar3;
  element_type *peVar4;
  mapped_type *pmVar5;
  VarException *pVVar6;
  element_type *peVar7;
  element_type *peVar8;
  element_type *port_00;
  remove_reference_t<std::__cxx11::basic_string<char>_> *in_RCX;
  char (*format_str) [36];
  char (*format_str_00) [49];
  char (*format_str_01) [36];
  char (*format_str_02) [49];
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  string_view format_str_03;
  string_view format_str_04;
  string_view format_str_05;
  string_view format_str_06;
  allocator<const_kratos::IRNode_*> local_5b1;
  element_type *local_5b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_5a8;
  Stmt *local_5a0;
  element_type **local_598;
  size_type local_590;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_588;
  v7 local_570 [32];
  string local_550;
  _Node_iterator_base<std::pair<kratos::Port_*const,_bool>,_false> local_530;
  element_type *local_528;
  _Node_iterator_base<std::pair<kratos::Port_*const,_bool>,_false> local_520;
  undefined1 local_512;
  allocator<const_kratos::IRNode_*> local_511;
  element_type *local_510;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_508;
  element_type **local_500;
  size_type local_4f8;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_4f0;
  allocator<char> local_4d1;
  string local_4d0;
  element_type *local_4b0;
  byte local_4a3;
  undefined1 local_4a2;
  allocator<const_kratos::IRNode_*> local_4a1;
  bool reset_high_1;
  element_type *peStack_4a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_498;
  iterator local_490;
  size_type local_488;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_480;
  v7 local_468 [32];
  string local_448;
  _Node_iterator_base<std::pair<kratos::Port_*const,_bool>,_false> local_428;
  element_type *local_420;
  _Node_iterator_base<std::pair<kratos::Port_*const,_bool>,_false> local_418;
  undefined1 local_410 [8];
  shared_ptr<kratos::Port> port_1;
  shared_ptr<kratos::Var> var;
  shared_ptr<kratos::Expr> expr;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_3d8;
  Stmt *local_3c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *local_3c0;
  pointer local_3b8;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_3b0;
  v7 local_398 [32];
  string local_378;
  _Node_iterator_base<std::pair<kratos::Port_*const,_bool>,_false> local_358;
  _Node_iterator_base<std::pair<kratos::Port_*const,_bool>,_false> local_350;
  undefined1 local_342;
  allocator<const_kratos::IRNode_*> local_341;
  Port *local_340;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_338;
  Port **local_330;
  __node_base_ptr local_328;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_320;
  allocator<char> local_301;
  string local_300;
  byte local_2db;
  undefined1 local_2da;
  allocator<const_kratos::IRNode_*> local_2d9;
  bool reset_high;
  Port *pPStack_2d8;
  __node_base local_2d0;
  iterator local_2c8;
  size_type local_2c0;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_2b8;
  v7 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [16];
  Port *local_250;
  element_type *port;
  shared_ptr<kratos::Port> port_s;
  undefined1 local_228 [8];
  shared_ptr<kratos::Var> predicate;
  IfStmt *stmt_local;
  ActiveVisitor *this_local;
  IRNode *local_200;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [32];
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_2;
  char *local_1c0 [2];
  _Base_ptr local_1b0;
  IRNode *local_1a8;
  _Base_ptr local_1a0;
  IRNode *local_198;
  _Base_ptr local_190;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_188;
  basic_string_view<char> local_178;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_168;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_150;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  __node_base local_140;
  element_type *local_138;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_130;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_128;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_120;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_118;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_110;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_108;
  _Prime_rehash_policy local_f8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_e8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_d0;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_3;
  pointer local_c0;
  string *local_b8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_b0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_a8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_98;
  undefined1 local_88 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_78;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_68 [3];
  _Base_ptr local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_1;
  char *local_40;
  string *local_38;
  _Base_ptr local_30;
  _Base_ptr local_28;
  _Base_ptr local_20;
  _Base_ptr local_18;
  _Base_ptr local_10;
  
  predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)stmt;
  IfStmt::predicate((IfStmt *)local_228);
  peVar4 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_228);
  VVar2 = Var::type(peVar4);
  if (VVar2 == PortIO) {
    std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               local_228);
    Var::as<kratos::Port>((Var *)&port);
    local_250 = std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get
                          ((__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)&port);
    PVar3 = Port::port_type(local_250);
    if (PVar3 == AsyncReset) {
      local_260._8_8_ =
           std::
           unordered_map<kratos::Port_*,_bool,_std::hash<kratos::Port_*>,_std::equal_to<kratos::Port_*>,_std::allocator<std::pair<kratos::Port_*const,_bool>_>_>
           ::find(&this->reset_map_,&local_250);
      local_260._0_8_ =
           std::
           unordered_map<kratos::Port_*,_bool,_std::hash<kratos::Port_*>,_std::equal_to<kratos::Port_*>,_std::allocator<std::pair<kratos::Port_*const,_bool>_>_>
           ::end(&this->reset_map_);
      bVar1 = std::__detail::operator==
                        ((_Node_iterator_base<std::pair<kratos::Port_*const,_bool>,_false> *)
                         (local_260 + 8),
                         (_Node_iterator_base<std::pair<kratos::Port_*const,_bool>,_false> *)
                         local_260);
      if (bVar1) {
        local_2da = 1;
        pVVar6 = (VarException *)__cxa_allocate_exception(0x10);
        (*(local_250->super_Var).super_IRNode._vptr_IRNode[0x1f])(local_2a0);
        local_138 = (element_type *)local_280;
        local_140._M_nxt = (_Hash_node_base *)0x427041;
        vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_2a0;
        local_168._vptr__Sp_counted_base =
             (_func_int **)
             fmt::v7::make_args_checked<std::__cxx11::string,char[36],char>
                       ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)"{0} is used has a synchronous reset",(v7 *)vargs,format_str,in_RCX);
        local_150._M_pi = &local_168;
        local_178 = fmt::v7::to_string_view<char,_0>((char *)local_140._M_nxt);
        local_128 = &local_188;
        local_130._M_pi = local_150._M_pi;
        local_120 = local_150._M_pi;
        local_110 = local_150._M_pi;
        local_118 = local_128;
        fmt::v7::
        basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        ::basic_format_args(local_128,0xd,
                            (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                             *)local_150._M_pi);
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.values_ = in_R9.values_;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)local_188.field_1.values_;
        format_str_03.size_ = local_188.desc_;
        format_str_03.data_ = (char *)local_178.size_;
        fmt::v7::detail::vformat_abi_cxx11_
                  ((string *)local_280,(detail *)local_178.data_,format_str_03,args);
        pPStack_2d8 = local_250;
        local_2d0._M_nxt =
             (_Hash_node_base *)
             predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        ;
        local_2c8 = (iterator)&stack0xfffffffffffffd28;
        local_2c0 = 2;
        std::allocator<const_kratos::IRNode_*>::allocator(&local_2d9);
        __l_04._M_len = local_2c0;
        __l_04._M_array = local_2c8;
        std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                  (&local_2b8,__l_04,&local_2d9);
        VarException::VarException(pVVar6,(string *)local_280,&local_2b8);
        local_2da = 0;
        __cxa_throw(pVVar6,&VarException::typeinfo,VarException::~VarException);
      }
      pmVar5 = std::
               unordered_map<kratos::Port_*,_bool,_std::hash<kratos::Port_*>,_std::equal_to<kratos::Port_*>,_std::allocator<std::pair<kratos::Port_*const,_bool>_>_>
               ::at(&this->reset_map_,&local_250);
      local_2db = *pmVar5 & 1;
      if (local_2db == 0) {
        local_342 = 1;
        pVVar6 = (VarException *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_300,"Active low signal used as active high",&local_301);
        local_340 = local_250;
        local_338 = predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
        local_330 = &local_340;
        local_328 = (__node_base_ptr)0x2;
        std::allocator<const_kratos::IRNode_*>::allocator(&local_341);
        __l_03._M_len = (size_type)local_328;
        __l_03._M_array = (iterator)local_330;
        std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                  (&local_320,__l_03,&local_341);
        VarException::VarException(pVVar6,&local_300,&local_320);
        local_342 = 0;
        __cxa_throw(pVVar6,&VarException::typeinfo,VarException::~VarException);
      }
    }
    else {
      PVar3 = Port::port_type(local_250);
      if (PVar3 == Reset) {
        local_350._M_cur =
             (__node_type *)
             std::
             unordered_map<kratos::Port_*,_bool,_std::hash<kratos::Port_*>,_std::equal_to<kratos::Port_*>,_std::allocator<std::pair<kratos::Port_*const,_bool>_>_>
             ::find(&this->reset_map_,&local_250);
        local_358._M_cur =
             (__node_type *)
             std::
             unordered_map<kratos::Port_*,_bool,_std::hash<kratos::Port_*>,_std::equal_to<kratos::Port_*>,_std::allocator<std::pair<kratos::Port_*const,_bool>_>_>
             ::end(&this->reset_map_);
        bVar1 = std::__detail::operator!=(&local_350,&local_358);
        if (bVar1) {
          expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_
               = 1;
          pVVar6 = (VarException *)__cxa_allocate_exception(0x10);
          (*(local_250->super_Var).super_IRNode._vptr_IRNode[0x1f])(local_398);
          local_38 = &local_378;
          local_40 = "{0} is synchronous reset but used as async reset";
          vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_398;
          local_68[0] = fmt::v7::make_args_checked<std::__cxx11::string,char[49],char>
                                  ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)"{0} is synchronous reset but used as async reset",
                                   (v7 *)vargs_1,format_str_00,in_RCX);
          local_50 = (_Base_ptr)local_68;
          local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
                      )fmt::v7::to_string_view<char,_0>(local_40);
          local_28 = (_Base_ptr)local_88;
          local_30 = local_50;
          local_20 = local_50;
          local_10 = local_50;
          local_18 = local_28;
          fmt::v7::
          basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          ::basic_format_args((basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                               *)local_28,0xd,
                              (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                               *)local_50);
          args_00.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.values_ = in_R9.values_;
          args_00.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = local_88._8_8_;
          format_str_04.size_ = local_88._0_8_;
          format_str_04.data_ = (char *)local_78._8_8_;
          fmt::v7::detail::vformat_abi_cxx11_
                    (&local_378,(detail *)local_78._M_allocated_capacity,format_str_04,args_00);
          local_3d8._M_allocated_capacity = (size_type)local_250;
          local_3d8._8_8_ =
               predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
          local_3c8 = get_reset_stmt(this,local_250);
          local_3c0 = &local_3d8;
          local_3b8 = (pointer)0x3;
          this_00 = (allocator<const_kratos::IRNode_*> *)
                    ((long)&expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi + 7);
          std::allocator<const_kratos::IRNode_*>::allocator(this_00);
          __l_02._M_len = (size_type)local_3b8;
          __l_02._M_array = (iterator)local_3c0;
          std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                    (&local_3b0,__l_02,this_00);
          VarException::VarException(pVVar6,&local_378,&local_3b0);
          expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_
               = 0;
          __cxa_throw(pVVar6,&VarException::typeinfo,VarException::~VarException);
        }
      }
    }
    std::shared_ptr<kratos::Port>::~shared_ptr((shared_ptr<kratos::Port> *)&port);
  }
  else {
    peVar4 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_228);
    VVar2 = Var::type(peVar4);
    if (VVar2 == Expression) {
      std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 local_228);
      Var::as<kratos::Expr>
                ((Var *)&var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
      peVar7 = std::__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
      if ((peVar7->op == UNot) ||
         (peVar7 = std::__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount), peVar7->op == UInvert)) {
        std::__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   &var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        Var::as<kratos::Var>
                  ((Var *)&port_1.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
        peVar4 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&port_1.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
        VVar2 = Var::type(peVar4);
        if (VVar2 == PortIO) {
          std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     &port_1.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          Var::as<kratos::Port>((Var *)local_410);
          peVar8 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_410);
          PVar3 = Port::port_type(peVar8);
          if (PVar3 == AsyncReset) {
            local_420 = std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get
                                  ((__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)
                                   local_410);
            local_418._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<kratos::Port_*,_bool,_std::hash<kratos::Port_*>,_std::equal_to<kratos::Port_*>,_std::allocator<std::pair<kratos::Port_*const,_bool>_>_>
                 ::find(&this->reset_map_,&local_420);
            local_428._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<kratos::Port_*,_bool,_std::hash<kratos::Port_*>,_std::equal_to<kratos::Port_*>,_std::allocator<std::pair<kratos::Port_*const,_bool>_>_>
                 ::end(&this->reset_map_);
            bVar1 = std::__detail::operator==(&local_418,&local_428);
            if (bVar1) {
              local_4a2 = 1;
              pVVar6 = (VarException *)__cxa_allocate_exception(0x10);
              peVar8 = std::
                       __shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                       operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_410);
              (*(peVar8->super_Var).super_IRNode._vptr_IRNode[0x1f])(local_468);
              local_1c0[1] = (char *)&local_448;
              local_1c0[0] = "{0} is used has a synchronous reset";
              vargs_2 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_468;
              local_1e8._0_8_ =
                   fmt::v7::make_args_checked<std::__cxx11::string,char[36],char>
                             ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)"{0} is used has a synchronous reset",(v7 *)vargs_2,format_str_01,
                              in_RCX);
              local_1e8._24_8_ = local_1e8;
              local_1f8 = (undefined1  [16])fmt::v7::to_string_view<char,_0>(local_1c0[0]);
              local_1a8 = (IRNode *)&this_local;
              local_1b0 = (_Base_ptr)local_1e8._24_8_;
              local_1a0 = (_Base_ptr)local_1e8._24_8_;
              local_190 = (_Base_ptr)local_1e8._24_8_;
              local_198 = local_1a8;
              fmt::v7::
              basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              ::basic_format_args((basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                                   *)local_1a8,0xd,
                                  (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                                   *)local_1e8._24_8_);
              args_01.
              super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              .field_1.values_ = in_R9.values_;
              args_01.
              super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              .desc_ = (unsigned_long_long)local_200;
              format_str_05.size_ = (size_t)this_local;
              format_str_05.data_ = (char *)local_1f8._8_8_;
              fmt::v7::detail::vformat_abi_cxx11_
                        (&local_448,(detail *)local_1f8._0_8_,format_str_05,args_01);
              peStack_4a0 = std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get
                                      ((__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)
                                       local_410);
              local_498 = predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
              local_490 = (iterator)&stack0xfffffffffffffb60;
              local_488 = 2;
              std::allocator<const_kratos::IRNode_*>::allocator(&local_4a1);
              __l_01._M_len = local_488;
              __l_01._M_array = local_490;
              std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                        (&local_480,__l_01,&local_4a1);
              VarException::VarException(pVVar6,&local_448,&local_480);
              local_4a2 = 0;
              __cxa_throw(pVVar6,&VarException::typeinfo,VarException::~VarException);
            }
            local_4b0 = std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get
                                  ((__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)
                                   local_410);
            pmVar5 = std::
                     unordered_map<kratos::Port_*,_bool,_std::hash<kratos::Port_*>,_std::equal_to<kratos::Port_*>,_std::allocator<std::pair<kratos::Port_*const,_bool>_>_>
                     ::at(&this->reset_map_,&local_4b0);
            local_4a3 = *pmVar5 & 1;
            if (local_4a3 != 0) {
              local_512 = 1;
              pVVar6 = (VarException *)__cxa_allocate_exception(0x10);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_4d0,"Active high signal used as active low",&local_4d1);
              local_510 = std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get
                                    ((__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)
                                     local_410);
              local_508 = predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
              local_500 = &local_510;
              local_4f8 = 2;
              std::allocator<const_kratos::IRNode_*>::allocator(&local_511);
              __l_00._M_len = local_4f8;
              __l_00._M_array = (iterator)local_500;
              std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                        (&local_4f0,__l_00,&local_511);
              VarException::VarException(pVVar6,&local_4d0,&local_4f0);
              local_512 = 0;
              __cxa_throw(pVVar6,&VarException::typeinfo,VarException::~VarException);
            }
            local_4a3 = 0;
          }
          else {
            peVar8 = std::
                     __shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_410);
            PVar3 = Port::port_type(peVar8);
            if (PVar3 == Reset) {
              local_528 = std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get
                                    ((__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)
                                     local_410);
              local_520._M_cur =
                   (__node_type *)
                   std::
                   unordered_map<kratos::Port_*,_bool,_std::hash<kratos::Port_*>,_std::equal_to<kratos::Port_*>,_std::allocator<std::pair<kratos::Port_*const,_bool>_>_>
                   ::find(&this->reset_map_,&local_528);
              local_530._M_cur =
                   (__node_type *)
                   std::
                   unordered_map<kratos::Port_*,_bool,_std::hash<kratos::Port_*>,_std::equal_to<kratos::Port_*>,_std::allocator<std::pair<kratos::Port_*const,_bool>_>_>
                   ::end(&this->reset_map_);
              bVar1 = std::__detail::operator!=(&local_520,&local_530);
              if (bVar1) {
                pVVar6 = (VarException *)__cxa_allocate_exception(0x10);
                peVar8 = std::
                         __shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_410);
                (*(peVar8->super_Var).super_IRNode._vptr_IRNode[0x1f])(local_570);
                local_b8 = &local_550;
                local_c0 = (pointer)0x42708b;
                vargs_3 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_570;
                local_e8.named_args.data =
                     (named_arg_info<char> *)
                     fmt::v7::make_args_checked<std::__cxx11::string,char[49],char>
                               ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)"{0} is synchronous reset but used as async reset",(v7 *)vargs_3,
                                format_str_02,in_RCX);
                local_d0 = &local_e8;
                local_f8 = (_Prime_rehash_policy)fmt::v7::to_string_view<char,_0>((char *)local_c0);
                local_a8 = &local_108;
                local_b0 = local_d0;
                local_a0 = local_d0;
                local_98._8_8_ = local_d0;
                local_98._M_allocated_capacity = (size_type)local_a8;
                fmt::v7::
                basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                ::basic_format_args(local_a8,0xd,
                                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                                     *)&local_d0->string);
                args_02.
                super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                .field_1.values_ = in_R9.values_;
                args_02.
                super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                .desc_ = (unsigned_long_long)local_108.field_1.values_;
                format_str_06.size_ = local_108.desc_;
                format_str_06.data_ = (char *)local_f8._M_next_resize;
                fmt::v7::detail::vformat_abi_cxx11_
                          (&local_550,(detail *)local_f8._0_8_,format_str_06,args_02);
                local_5b0 = std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get
                                      ((__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)
                                       local_410);
                local_5a8 = predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi;
                port_00 = std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get
                                    ((__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)
                                     local_410);
                local_5a0 = get_reset_stmt(this,port_00);
                local_598 = &local_5b0;
                local_590 = 3;
                std::allocator<const_kratos::IRNode_*>::allocator(&local_5b1);
                __l._M_len = local_590;
                __l._M_array = (iterator)local_598;
                std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                          (&local_588,__l,&local_5b1);
                VarException::VarException(pVVar6,&local_550,&local_588);
                __cxa_throw(pVVar6,&VarException::typeinfo,VarException::~VarException);
              }
            }
          }
          std::shared_ptr<kratos::Port>::~shared_ptr((shared_ptr<kratos::Port> *)local_410);
        }
        std::shared_ptr<kratos::Var>::~shared_ptr
                  ((shared_ptr<kratos::Var> *)
                   &port_1.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
        ;
      }
      std::shared_ptr<kratos::Expr>::~shared_ptr
                ((shared_ptr<kratos::Expr> *)
                 &var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
  }
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_228);
  return;
}

Assistant:

void visit(IfStmt* stmt) override {
        auto predicate = stmt->predicate();
        // notice this just catch some simple mistakes
        // thus is designed to be zero false negative
        if (predicate->type() == VarType::PortIO) {
            auto port_s = predicate->as<Port>();
            auto* port = port_s.get();
            if (port->port_type() == PortType::AsyncReset) {
                if (reset_map_.find(port) == reset_map_.end()) {
                    // it's used as a sync reset
                    throw VarException(
                        ::format("{0} is used has a synchronous reset", port->to_string()),
                        {port, stmt});
                }
                bool reset_high = reset_map_.at(port);
                if (!reset_high)
                    throw VarException("Active low signal used as active high", {port, stmt});
            } else if (port->port_type() == PortType::Reset) {
                if (reset_map_.find(port) != reset_map_.end()) {
                    throw VarException(::format("{0} is synchronous reset but used as async reset",
                                                port->to_string()),
                                       {port, stmt, get_reset_stmt(port)});
                }
            }
        } else if (predicate->type() == VarType::Expression) {
            auto expr = predicate->as<Expr>();
            if (expr->op == ExprOp::UNot || expr->op == ExprOp::UInvert) {
                auto var = expr->left->as<Var>();
                if (var->type() == VarType::PortIO) {
                    auto port = var->as<Port>();
                    if (port->port_type() == PortType::AsyncReset) {
                        if (reset_map_.find(port.get()) == reset_map_.end()) {
                            // it's used as a sync reset
                            throw VarException(
                                ::format("{0} is used has a synchronous reset", port->to_string()),
                                {port.get(), stmt});
                        }
                        bool reset_high = reset_map_.at(port.get());
                        if (reset_high) {
                            throw VarException("Active high signal used as active low",
                                               {port.get(), stmt});
                        }
                    } else if (port->port_type() == PortType::Reset) {
                        if (reset_map_.find(port.get()) != reset_map_.end()) {
                            throw VarException(
                                ::format("{0} is synchronous reset but used as async reset",
                                         port->to_string()),
                                {port.get(), stmt, get_reset_stmt(port.get())});
                        }
                    }
                }
            }
        }
    }